

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMemoryStressTests.cpp
# Opt level: O1

void __thiscall deqp::egl::MemoryStressCase::deinit(MemoryStressCase *this)

{
  MemoryAllocator *this_00;
  Library *pLVar1;
  
  this_00 = this->m_allocator;
  if (this_00 != (MemoryAllocator *)0x0) {
    egl::anon_unknown_0::MemoryAllocator::~MemoryAllocator(this_00);
    operator_delete(this_00,0x1ac0);
  }
  this->m_allocator = (MemoryAllocator *)0x0;
  if (this->m_display != (EGLDisplay)0x0) {
    pLVar1 = EglTestContext::getLibrary((this->super_TestCase).m_eglTestCtx);
    (*pLVar1->_vptr_Library[0x34])(pLVar1,this->m_display);
    this->m_display = (EGLDisplay)0x0;
  }
  return;
}

Assistant:

void MemoryStressCase::deinit (void)
{
	delete m_allocator;
	m_allocator = DE_NULL;

	if (m_display != EGL_NO_DISPLAY)
	{
		m_eglTestCtx.getLibrary().terminate(m_display);
		m_display = EGL_NO_DISPLAY;
	}
}